

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O1

double CheckInsideObstacle(double x,double y,bool measureDist)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> vertx;
  vector<double,_std::allocator<double>_> verty;
  double local_c8;
  double local_c0;
  void *local_b8;
  iterator iStack_b0;
  double *local_a8;
  void *local_98;
  iterator iStack_90;
  double *local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_b8 = (void *)0x0;
  iStack_b0._M_current = (double *)0x0;
  local_a8 = (double *)0x0;
  local_88 = (double *)0x0;
  local_98 = (void *)0x0;
  iStack_90._M_current = (double *)0x0;
  local_70 = x;
  local_68 = y;
  if ((int)((ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < 1) {
    local_58 = -1.0;
  }
  else {
    lVar7 = 0;
    dVar9 = -1.0;
    do {
      dVar10 = circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      dVar8 = (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] - local_68) *
              (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] - local_68) +
              (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] - local_70) *
              (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] - local_70);
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar10 = dVar10 - dVar8;
      local_58 = dVar10;
      if (!measureDist) {
        if ((((dVar10 != 0.0) || (NAN(dVar10))) && (local_58 = 1.0, dVar10 < 0.0)) &&
           (local_58 = -1.0, 0.0 < dVar10)) {
          local_58 = 0.0;
        }
      }
      if (local_58 <= dVar9) {
        local_58 = dVar9;
      }
      lVar7 = lVar7 + 1;
      dVar9 = local_58;
    } while (lVar7 < (int)((ulong)((long)circles_r.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)circles_r.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
  }
  if ((int)((ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < 1) {
    local_c8 = 10000.0;
    local_78 = 10000.0;
    local_c0 = -10000.0;
    local_80 = -10000.0;
  }
  else {
    lVar7 = 0;
    lVar6 = 0;
    local_80 = -10000.0;
    local_c0 = -10000.0;
    local_78 = 10000.0;
    local_c8 = 10000.0;
    do {
      local_48 = *(double *)
                  ((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar7);
      local_50 = *(double *)
                  ((long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar7);
      local_38 = *(double *)
                  ((long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar7);
      local_40 = *(double *)
                  ((long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar7);
      if (iStack_b0._M_current == local_a8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_b8,iStack_b0,
                   (double *)
                   ((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar7));
      }
      else {
        *iStack_b0._M_current = local_48;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      if (iStack_b0._M_current == local_a8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_b8,iStack_b0,
                   (double *)
                   ((long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar7));
      }
      else {
        *iStack_b0._M_current =
             *(double *)
              ((long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar7);
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      if (iStack_90._M_current == local_88) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_98,iStack_90,
                   (double *)
                   ((long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar7));
      }
      else {
        *iStack_90._M_current =
             *(double *)
              ((long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar7);
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      if (iStack_90._M_current == local_88) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_98,iStack_90,
                   (double *)
                   ((long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar7));
      }
      else {
        *iStack_90._M_current =
             *(double *)
              ((long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar7);
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      if (local_48 <= local_c8) {
        local_c8 = local_48;
      }
      if (local_50 <= local_c8) {
        local_c8 = local_50;
      }
      if (local_c0 <= local_48) {
        local_c0 = local_48;
      }
      if (local_c0 <= local_50) {
        local_c0 = local_50;
      }
      if (local_38 <= local_78) {
        local_78 = local_38;
      }
      if (local_40 <= local_78) {
        local_78 = local_40;
      }
      if (local_80 <= local_38) {
        local_80 = local_38;
      }
      if (local_80 <= local_40) {
        local_80 = local_40;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar6 < (int)((ulong)((long)walls_xa.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  dVar9 = local_c8;
  local_c8 = -1.0;
  if (((dVar9 <= local_70) && (local_70 <= local_c0)) &&
     ((local_78 <= local_68 && (local_68 <= local_80)))) {
    uVar4 = (ulong)((long)iStack_b0._M_current - (long)local_b8) >> 3;
    uVar3 = (uint)uVar4;
    if (0 < (int)uVar3) {
      bVar2 = false;
      uVar4 = uVar4 - 1;
      uVar5 = 0;
      do {
        dVar9 = *(double *)((long)local_98 + uVar5 * 8);
        dVar10 = *(double *)((long)local_98 + (long)(int)uVar4 * 8);
        if ((dVar10 <= local_68 == local_68 < dVar9) &&
           (dVar8 = *(double *)((long)local_b8 + uVar5 * 8),
           local_70 <
           ((local_68 - dVar9) * (*(double *)((long)local_b8 + (long)(int)uVar4 * 8) - dVar8)) /
           (dVar10 - dVar9) + dVar8)) {
          bVar2 = !bVar2;
        }
        uVar1 = uVar5 + 1;
        uVar4 = uVar5;
        uVar5 = uVar1;
      } while ((uVar3 & 0x7fffffff) != uVar1);
      if (bVar2) {
        local_c8 = 1.0;
      }
    }
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (local_c8 <= local_58) {
    local_c8 = local_58;
  }
  return local_c8;
}

Assistant:

inline double CheckInsideObstacle(double x, double y, bool measureDist)
{
	double result = -1;

#ifndef DISABLE_OPENCV_SUPPORT
	int i = 0;
	double d = 0;
	vector<cv::Point2f> contours;

	// Environment circles.
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		d = circles_r[i]-sqrt(sqr(circles_x[i]-x)+sqr(circles_y[i]-y));
		if ((!measureDist)&&(d != 0)) d = sign(d, 0);
		result = max(d, result);
	}

	// Environment walls.
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		contours.push_back(cv::Point2f((float)walls_xa[i], (float)walls_ya[i]));
		contours.push_back(cv::Point2f((float)walls_xb[i], (float)walls_yb[i]));
	}
	if (contours.size() > 0) result = max(cv::pointPolygonTest(contours, cv::Point2f((float)x, (float)y), measureDist), result);
#else
	int i = 0, j = 0, c = 0, nvert = 0;
	double d = 0, Xmin = MAX_UNCERTAINTY, Xmax = -MAX_UNCERTAINTY, Ymin = MAX_UNCERTAINTY, Ymax = -MAX_UNCERTAINTY;
	std::vector<double> vertx, verty;

	// Environment circles.
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		d = circles_r[i]-sqrt(sqr(circles_x[i]-x)+sqr(circles_y[i]-y));
		if ((!measureDist)&&(d != 0)) d = sign(d, 0);
		result = max(d, result);
	}

	// Environment walls.
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		Xmin = min(Xmin, walls_xa[i]); Xmin = min(Xmin, walls_xb[i]);
		Xmax = max(Xmax, walls_xa[i]); Xmax = max(Xmax, walls_xb[i]);
		Ymin = min(Ymin, walls_ya[i]); Ymin = min(Ymin, walls_yb[i]);
		Ymax = max(Ymax, walls_ya[i]); Ymax = max(Ymax, walls_yb[i]);
		vertx.push_back(walls_xa[i]);
		vertx.push_back(walls_xb[i]);
		verty.push_back(walls_ya[i]);
		verty.push_back(walls_yb[i]);
	}
	// First check bounding rectangle.
	if ((x < Xmin)||(x > Xmax)||(y < Ymin)||(y > Ymax))
	{
		// Approximation...
		result = max(-1.0, result);
	}
	else
	{
		// Approximation...
		// https://stackoverflow.com/questions/217578/how-can-i-determine-whether-a-2d-point-is-within-a-polygon
		nvert = (int)vertx.size();
		for (i = 0, j = nvert-1; i < nvert; j = i++)
		{
			if (((verty[i] > y) != (verty[j]> y)) &&
				(x < (vertx[j]-vertx[i]) * (y-verty[i]) / (verty[j]-verty[i]) + vertx[i]))
				c = !c;
		}
		if (c) result = max(1.0, result); else result = max(-1.0, result);
	}
#endif // !DISABLE_OPENCV_SUPPORT

	return result;
}